

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test_cases.cpp
# Opt level: O1

void anon_unknown.dwarf_29ef58::check(pbf_reader message)

{
  StringRef capturedExpression;
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  data_view dVar4;
  pbf_tag_type in_stack_0000001c;
  AssertionHandler catchAssertionHandler;
  ITransientExpression local_190;
  char **local_180;
  char *local_178;
  size_t sStack_170;
  string *local_168;
  string local_160;
  int local_13c;
  pbf_reader local_138;
  undefined1 local_11c [4];
  string local_118;
  undefined1 local_f8 [16];
  AssertionHandler local_e8;
  data_view local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  bVar1 = protozero::pbf_reader::next((pbf_reader *)&stack0x00000008);
  if (bVar1) {
    do {
      if (in_stack_0000001c == 2) {
        local_190._vptr_ITransientExpression = (_func_int **)0x20fa06;
        local_190.m_isBinaryExpression = true;
        local_190.m_result = false;
        local_190._10_6_ = 0;
        local_160._M_dataplus._M_p =
             "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/nested/reader_test_cases.cpp"
        ;
        local_160._M_string_length = 0x34;
        Catch::StringRef::StringRef(&local_80,"77 == message.get_int32()");
        Catch::AssertionHandler::AssertionHandler
                  (&local_e8,(StringRef *)&local_190,(SourceLineInfo *)&local_160,local_80,Normal);
        local_138.m_data = (char *)CONCAT44(local_138.m_data._4_4_,0x4d);
        iVar3 = protozero::pbf_reader::get_int32((pbf_reader *)&stack0x00000008);
        local_118._M_dataplus._M_p._0_4_ = iVar3;
        iVar2 = (int)local_138.m_data;
        Catch::StringRef::StringRef((StringRef *)&local_160,"==");
        local_190.m_result = iVar2 == iVar3;
        local_190.m_isBinaryExpression = true;
        local_190._vptr_ITransientExpression =
             (_func_int **)&PTR_streamReconstructedExpression_00258570;
        local_178 = local_160._M_dataplus._M_p;
        sStack_170 = local_160._M_string_length;
        local_168 = (string *)(local_11c + 4);
        local_180 = &local_138.m_data;
        Catch::AssertionHandler::handleExpr(&local_e8,&local_190);
        Catch::ITransientExpression::~ITransientExpression(&local_190);
        Catch::AssertionHandler::complete(&local_e8);
        if (local_e8.m_completed == false) {
          (*(local_e8.m_resultCapture)->_vptr_IResultCapture[0xe])
                    (local_e8.m_resultCapture,&local_e8);
        }
      }
      else if (in_stack_0000001c == 1) {
        dVar4 = protozero::pbf_reader::get_view((pbf_reader *)&stack0x00000008);
        local_118._M_dataplus._M_p = dVar4.m_data;
        local_118._M_string_length = (size_type)(local_118._M_dataplus._M_p + dVar4.m_size);
        local_118.field_2._0_8_ = 99;
        while( true ) {
          bVar1 = protozero::pbf_reader::next((pbf_reader *)(local_11c + 4));
          if (!bVar1) break;
          if (local_118.field_2._4_4_ == 2) {
            local_190._vptr_ITransientExpression = (_func_int **)0x20fa06;
            local_190.m_isBinaryExpression = true;
            local_190.m_result = false;
            local_190._10_6_ = 0;
            local_160._M_dataplus._M_p =
                 "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/nested/reader_test_cases.cpp"
            ;
            local_160._M_string_length = 0x21;
            Catch::StringRef::StringRef(&local_60,"88 == message.get_int32()");
            Catch::AssertionHandler::AssertionHandler
                      (&local_e8,(StringRef *)&local_190,(SourceLineInfo *)&local_160,local_60,
                       Normal);
            local_138.m_data = (char *)CONCAT44(local_138.m_data._4_4_,0x58);
            iVar3 = protozero::pbf_reader::get_int32((pbf_reader *)(local_11c + 4));
            iVar2 = (int)local_138.m_data;
            local_f8._0_4_ = iVar3;
            Catch::StringRef::StringRef((StringRef *)&local_160,"==");
            local_190.m_result = iVar2 == iVar3;
            local_190.m_isBinaryExpression = true;
            local_190._vptr_ITransientExpression =
                 (_func_int **)&PTR_streamReconstructedExpression_00258570;
            local_178 = local_160._M_dataplus._M_p;
            sStack_170 = local_160._M_string_length;
            local_168 = (string *)local_f8;
            local_180 = &local_138.m_data;
            Catch::AssertionHandler::handleExpr(&local_e8,&local_190);
            Catch::ITransientExpression::~ITransientExpression(&local_190);
            Catch::AssertionHandler::complete(&local_e8);
            if (local_e8.m_completed == false) {
              (*(local_e8.m_resultCapture)->_vptr_IResultCapture[0xe])
                        (local_e8.m_resultCapture,&local_e8);
            }
          }
          else if (local_118.field_2._4_4_ == 1) {
            dVar4 = protozero::pbf_reader::get_view((pbf_reader *)(local_11c + 4));
            local_138.m_data = dVar4.m_data;
            local_138.m_end = local_138.m_data + dVar4.m_size;
            local_138.m_wire_type = unknown;
            local_138.m_tag = 0;
            while( true ) {
              bVar1 = protozero::pbf_reader::next(&local_138);
              if (!bVar1) break;
              if (local_138.m_tag == 2) {
                local_190._vptr_ITransientExpression = (_func_int **)0x20fa06;
                local_190.m_isBinaryExpression = true;
                local_190.m_result = false;
                local_190._10_6_ = 0;
                local_160._M_dataplus._M_p =
                     "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/nested/reader_test_cases.cpp"
                ;
                local_160._M_string_length = 0xe;
                Catch::StringRef::StringRef(&local_40,"99 == message.get_int32()");
                Catch::AssertionHandler::AssertionHandler
                          (&local_e8,(StringRef *)&local_190,(SourceLineInfo *)&local_160,local_40,
                           Normal);
                local_13c = 99;
                iVar3 = protozero::pbf_reader::get_int32(&local_138);
                iVar2 = local_13c;
                local_11c = (undefined1  [4])iVar3;
                Catch::StringRef::StringRef((StringRef *)&local_160,"==");
                local_190.m_result = iVar2 == iVar3;
                local_190.m_isBinaryExpression = true;
                local_190._vptr_ITransientExpression =
                     (_func_int **)&PTR_streamReconstructedExpression_00258570;
                local_180 = (char **)&local_13c;
                local_178 = local_160._M_dataplus._M_p;
                sStack_170 = local_160._M_string_length;
                local_168 = (string *)local_11c;
                Catch::AssertionHandler::handleExpr(&local_e8,&local_190);
                Catch::ITransientExpression::~ITransientExpression(&local_190);
                Catch::AssertionHandler::complete(&local_e8);
                if (local_e8.m_completed == false) {
                  (*(local_e8.m_resultCapture)->_vptr_IResultCapture[0xe])
                            (local_e8.m_resultCapture,&local_e8);
                }
              }
              else if (local_138.m_tag == 1) {
                local_190._vptr_ITransientExpression = (_func_int **)0x20fa06;
                local_190.m_isBinaryExpression = true;
                local_190.m_result = false;
                local_190._10_6_ = 0;
                local_160._M_dataplus._M_p =
                     "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/nested/reader_test_cases.cpp"
                ;
                local_160._M_string_length = 10;
                Catch::StringRef::StringRef
                          ((StringRef *)local_f8,"\"foobar\" == message.get_string()");
                capturedExpression._4_12_ = local_f8._4_12_;
                capturedExpression.m_start._0_4_ = local_f8._0_4_;
                Catch::AssertionHandler::AssertionHandler
                          (&local_e8,(StringRef *)&local_190,(SourceLineInfo *)&local_160,
                           capturedExpression,Normal);
                local_a0 = protozero::pbf_reader::get_view(&local_138);
                protozero::data_view::operator_cast_to_string(&local_160,&local_a0);
                iVar2 = std::__cxx11::string::compare((char *)&local_160);
                Catch::StringRef::StringRef((StringRef *)&local_a0,"==");
                local_190.m_result = iVar2 == 0;
                local_190.m_isBinaryExpression = true;
                local_190._vptr_ITransientExpression =
                     (_func_int **)&PTR_streamReconstructedExpression_00258770;
                local_180 = (char **)0x21063b;
                local_178 = local_a0.m_data;
                sStack_170 = local_a0.m_size;
                local_168 = &local_160;
                Catch::AssertionHandler::handleExpr(&local_e8,&local_190);
                Catch::ITransientExpression::~ITransientExpression(&local_190);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_160._M_dataplus._M_p != &local_160.field_2) {
                  operator_delete(local_160._M_dataplus._M_p,
                                  local_160.field_2._M_allocated_capacity + 1);
                }
                Catch::AssertionHandler::complete(&local_e8);
                if (local_e8.m_completed == false) {
                  (*(local_e8.m_resultCapture)->_vptr_IResultCapture[0xe])
                            (local_e8.m_resultCapture,&local_e8);
                }
              }
              else {
                local_190._vptr_ITransientExpression = (_func_int **)0x20fa06;
                local_190.m_isBinaryExpression = true;
                local_190.m_result = false;
                local_190._10_6_ = 0;
                local_160._M_dataplus._M_p =
                     "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/nested/reader_test_cases.cpp"
                ;
                local_160._M_string_length = 0x12;
                Catch::StringRef::StringRef(&local_50,"false");
                Catch::AssertionHandler::AssertionHandler
                          (&local_e8,(StringRef *)&local_190,(SourceLineInfo *)&local_160,local_50,
                           Normal);
                local_190._vptr_ITransientExpression =
                     (_func_int **)
                     ((ulong)local_190._vptr_ITransientExpression & 0xffffffffffffff00);
                Catch::AssertionHandler::handleExpr<bool>(&local_e8,(ExprLhs<bool> *)&local_190);
                Catch::AssertionHandler::complete(&local_e8);
                if (local_e8.m_completed == false) {
                  (*(local_e8.m_resultCapture)->_vptr_IResultCapture[0xe])
                            (local_e8.m_resultCapture,&local_e8);
                }
              }
            }
          }
          else {
            local_190._vptr_ITransientExpression = (_func_int **)0x20fa06;
            local_190.m_isBinaryExpression = true;
            local_190.m_result = false;
            local_190._10_6_ = 0;
            local_160._M_dataplus._M_p =
                 "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/nested/reader_test_cases.cpp"
            ;
            local_160._M_string_length = 0x25;
            Catch::StringRef::StringRef(&local_70,"false");
            Catch::AssertionHandler::AssertionHandler
                      (&local_e8,(StringRef *)&local_190,(SourceLineInfo *)&local_160,local_70,
                       Normal);
            local_190._vptr_ITransientExpression =
                 (_func_int **)((ulong)local_190._vptr_ITransientExpression & 0xffffffffffffff00);
            Catch::AssertionHandler::handleExpr<bool>(&local_e8,(ExprLhs<bool> *)&local_190);
            Catch::AssertionHandler::complete(&local_e8);
            if (local_e8.m_completed == false) {
              (*(local_e8.m_resultCapture)->_vptr_IResultCapture[0xe])
                        (local_e8.m_resultCapture,&local_e8);
            }
          }
        }
      }
      else {
        local_190._vptr_ITransientExpression = (_func_int **)0x20fa06;
        local_190.m_isBinaryExpression = true;
        local_190.m_result = false;
        local_190._10_6_ = 0;
        local_160._M_dataplus._M_p =
             "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/nested/reader_test_cases.cpp"
        ;
        local_160._M_string_length = 0x38;
        Catch::StringRef::StringRef(&local_90,"false");
        Catch::AssertionHandler::AssertionHandler
                  (&local_e8,(StringRef *)&local_190,(SourceLineInfo *)&local_160,local_90,Normal);
        local_190._vptr_ITransientExpression =
             (_func_int **)((ulong)local_190._vptr_ITransientExpression & 0xffffffffffffff00);
        Catch::AssertionHandler::handleExpr<bool>(&local_e8,(ExprLhs<bool> *)&local_190);
        Catch::AssertionHandler::complete(&local_e8);
        if (local_e8.m_completed == false) {
          (*(local_e8.m_resultCapture)->_vptr_IResultCapture[0xe])
                    (local_e8.m_resultCapture,&local_e8);
        }
      }
      bVar1 = protozero::pbf_reader::next((pbf_reader *)&stack0x00000008);
    } while (bVar1);
  }
  return;
}

Assistant:

void check(protozero::pbf_reader message) {
    while (message.next()) {
        switch (message.tag()) {
            case 1: {
                check_sub(message.get_message());
                break;
            }
            case 2: {
                REQUIRE(77 == message.get_int32());
                break;
            }
            default: {
                REQUIRE(false); // should never be here
                break;
            }
        }
    }
}